

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O0

int vstumpless_trace_message
              (stumpless_target *target,char *file,int line,char *func,char *message,
              __va_list_tag *subs)

{
  __va_list_tag *subs_local;
  char *message_local;
  char *func_local;
  int line_local;
  char *file_local;
  stumpless_target *target_local;
  
  if (target == (stumpless_target *)0x0) {
    raise_argument_empty("target was NULL");
    target_local._4_4_ = -1;
  }
  else {
    target_local._4_4_ =
         vstumpless_trace_log(target,target->default_prival,file,line,func,message,subs);
  }
  return target_local._4_4_;
}

Assistant:

int
vstumpless_trace_message( struct stumpless_target *target,
                          const char *file,
                          int line,
                          const char *func,
                          const char *message,
                          va_list subs ) {
  VALIDATE_ARG_NOT_NULL_INT_RETURN( target );

  return vstumpless_trace_log( target,
                               target->default_prival,
                               file,
                               line,
                               func,
                               message,
                               subs );
}